

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_diagnostic.c
# Opt level: O0

_Bool should_add_diagnostic_info(IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double percentage;
  double number;
  _Bool result;
  IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting_local;
  
  number._7_1_ = false;
  if (diagSetting->diagSamplingPercentage != 0) {
    if (diagSetting->currentMessageNumber == 0xffffffff) {
      diagSetting->currentMessageNumber =
           diagSetting->currentMessageNumber % (diagSetting->diagSamplingPercentage * 100);
    }
    diagSetting->currentMessageNumber = diagSetting->currentMessageNumber + 1;
    uVar1 = diagSetting->currentMessageNumber;
    uVar2 = diagSetting->diagSamplingPercentage;
    dVar3 = floor((((double)uVar1 - 2.0) * (double)uVar2) / 100.0);
    dVar4 = floor((((double)uVar1 - 1.0) * (double)uVar2) / 100.0);
    number._7_1_ = dVar3 < dVar4;
  }
  return number._7_1_;
}

Assistant:

static bool should_add_diagnostic_info(IOTHUB_DIAGNOSTIC_SETTING_DATA* diagSetting)
{
    bool result = false;
    if (diagSetting->diagSamplingPercentage > 0)
    {
        double number;
        double percentage;

        if (diagSetting->currentMessageNumber == UINT32_MAX)
        {
            diagSetting->currentMessageNumber %= diagSetting->diagSamplingPercentage * 100;
        }
        ++diagSetting->currentMessageNumber;

        number = diagSetting->currentMessageNumber;
        percentage = diagSetting->diagSamplingPercentage;
        result = (floor((number - 2) * percentage / 100.0) < floor((number - 1) * percentage / 100.0));
    }
    return result;
}